

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-raster.c
# Opt level: O1

int gray_raster_render(PWorker worker,void *buffer,long buffer_size,PVG_FT_Raster_Params *params)

{
  uint uVar1;
  int *piVar2;
  PVG_FT_Vector *pPVar3;
  PVG_FT_Pos PVar4;
  PVG_FT_Pos PVar5;
  char *pcVar6;
  int *piVar7;
  char *pcVar8;
  int iVar9;
  long lVar10;
  PVG_FT_Vector *pPVar11;
  long lVar12;
  int iVar13;
  long lVar14;
  ulong uVar15;
  int unaff_EBP;
  int iVar16;
  long lVar17;
  long lVar18;
  TCoord x;
  PVG_FT_Pos PVar19;
  PCell_conflict pTVar20;
  TBand *band;
  int num_bands;
  int n;
  TPos max;
  TPos min;
  TPos max_y;
  TBand bands [40];
  long *local_2e0;
  int local_2d8;
  int local_2d4;
  long local_2d0;
  long local_2c8;
  long local_2b8;
  long local_2b0;
  
  piVar2 = (int *)params->source;
  if (piVar2 != (int *)0x0) {
    if (piVar2[1] == 0) {
      return 0;
    }
    if ((long)*piVar2 < 1) {
      return 0;
    }
    if ((*(long *)(piVar2 + 6) != 0) && (*(long *)(piVar2 + 2) != 0)) {
      if (piVar2[1] != *(int *)(*(long *)(piVar2 + 6) + -4 + (long)*piVar2 * 4) + 1) {
        return -1;
      }
      if ((~params->flags & 3U) != 0) {
        return -2;
      }
      if ((params->flags & 4U) == 0) {
        (worker->clip_box).xMin = -0x800000;
        (worker->clip_box).yMin = -0x800000;
        (worker->clip_box).xMax = 0x7fffff;
        (worker->clip_box).yMax = 0x7fffff;
      }
      else {
        PVar19 = (params->clip_box).xMin;
        PVar4 = (params->clip_box).yMin;
        PVar5 = (params->clip_box).yMax;
        (worker->clip_box).xMax = (params->clip_box).xMax;
        (worker->clip_box).yMax = PVar5;
        (worker->clip_box).xMin = PVar19;
        (worker->clip_box).yMin = PVar4;
      }
      worker->buffer = buffer;
      worker->buffer_size = buffer_size;
      worker->ycells = (PCell_conflict *)buffer;
      worker->area = 0;
      worker->cover = 0;
      worker->invalid = 1;
      worker->cells = (PCell_conflict)0x0;
      worker->max_cells = 0;
      worker->num_cells = 0;
      iVar16 = piVar2[1];
      pPVar3 = *(PVG_FT_Vector **)(piVar2 + 2);
      pcVar6 = *(char **)(piVar2 + 4);
      piVar7 = *(int **)(piVar2 + 6);
      pcVar8 = *(char **)(piVar2 + 8);
      iVar13 = piVar2[10];
      iVar9 = piVar2[0xb];
      (worker->outline).n_contours = piVar2[0];
      (worker->outline).n_points = iVar16;
      (worker->outline).points = pPVar3;
      (worker->outline).tags = pcVar6;
      (worker->outline).contours = piVar7;
      (worker->outline).contours_flag = pcVar8;
      (worker->outline).flags = iVar13;
      *(int *)&(worker->outline).field_0x2c = iVar9;
      worker->num_cells = 0;
      worker->invalid = 1;
      iVar13 = (int)(buffer_size / 0xc0);
      worker->band_size = iVar13;
      worker->render_span = params->gray_spans;
      worker->render_span_data = params->user;
      worker->num_gray_spans = 0;
      iVar16 = (worker->outline).n_points;
      if ((long)iVar16 < 1) {
        worker->min_ey = 0;
        worker->max_ey = 0;
        worker->min_ex = 0;
        worker->max_ex = 0;
      }
      else {
        pPVar3 = (worker->outline).points;
        lVar17 = pPVar3->x;
        worker->max_ex = lVar17;
        worker->min_ex = lVar17;
        PVar19 = pPVar3->y;
        worker->max_ey = PVar19;
        worker->min_ey = PVar19;
        if (iVar16 != 1) {
          pPVar11 = pPVar3 + 1;
          lVar14 = PVar19;
          lVar18 = lVar17;
          do {
            lVar10 = pPVar11->x;
            lVar12 = pPVar11->y;
            if (lVar10 < lVar18) {
              worker->min_ex = lVar10;
              lVar18 = lVar10;
            }
            if (lVar17 < lVar10) {
              worker->max_ex = lVar10;
              lVar17 = lVar10;
            }
            if (lVar12 < lVar14) {
              worker->min_ey = lVar12;
              lVar14 = lVar12;
            }
            if (PVar19 < lVar12) {
              worker->max_ey = lVar12;
              PVar19 = lVar12;
            }
            pPVar11 = pPVar11 + 1;
          } while (pPVar11 < pPVar3 + iVar16);
        }
        worker->min_ex = worker->min_ex >> 6;
        worker->min_ey = worker->min_ey >> 6;
        worker->max_ex = worker->max_ex + 0x3f >> 6;
        worker->max_ey = worker->max_ey + 0x3f >> 6;
      }
      lVar17 = (worker->clip_box).xMin;
      if (worker->max_ex <= lVar17) {
        return 0;
      }
      lVar14 = (worker->clip_box).xMax;
      if (lVar14 <= worker->min_ex) {
        return 0;
      }
      lVar18 = (worker->clip_box).yMin;
      if (worker->max_ey <= lVar18) {
        return 0;
      }
      lVar10 = (worker->clip_box).yMax;
      if (lVar10 <= worker->min_ey) {
        return 0;
      }
      if (worker->min_ex < lVar17) {
        worker->min_ex = lVar17;
      }
      if (worker->min_ey < lVar18) {
        worker->min_ey = lVar18;
      }
      if (lVar14 < worker->max_ex) {
        worker->max_ex = lVar14;
      }
      if (lVar10 < worker->max_ey) {
        worker->max_ey = lVar10;
      }
      local_2c8 = worker->min_ey;
      worker->count_ex = worker->max_ex - worker->min_ex;
      lVar17 = worker->max_ey;
      worker->count_ey = lVar17 - local_2c8;
      local_2d8 = (int)((lVar17 - local_2c8) / (long)iVar13);
      if (local_2d8 == 0) {
        local_2d8 = 1;
      }
      if (0x26 < local_2d8) {
        local_2d8 = 0x27;
      }
      worker->band_shoot = 0;
      local_2d4 = 0;
      if (0 < local_2d8) {
        do {
          local_2e0 = &local_2b8;
          local_2d0 = worker->band_size + local_2c8;
          if ((local_2d4 == local_2d8 + -1) || (lVar17 < local_2d0)) {
            local_2d0 = lVar17;
          }
          local_2b8 = local_2c8;
          local_2b0 = local_2d0;
          iVar16 = unaff_EBP;
          do {
            worker->ycells = (PCell_conflict *)worker->buffer;
            lVar18 = local_2e0[1] - *local_2e0;
            worker->ycount = lVar18;
            iVar9 = (int)lVar18 * 8;
            lVar14 = (long)iVar9 + ((ulong)(long)iVar9 / 3 & 0xfffffffffffffff8) * -3;
            iVar13 = (iVar9 - (int)lVar14) + 0x18;
            if (lVar14 == 0) {
              iVar13 = iVar9;
            }
            lVar14 = (long)((int)((ulong)(long)(int)worker->buffer_size / 0x18) * 0x18);
            lVar12 = (long)iVar13;
            worker->cells = (PCell_conflict)((long)worker->buffer + lVar12);
            iVar13 = 7;
            lVar10 = lVar14 - lVar12;
            if (((lVar10 != 0 && lVar12 <= lVar14) &&
                (worker->max_cells = (lVar10 >> 3) * -0x5555555555555555, 0x2f < lVar10)) &&
               (iVar13 = 0, 0 < lVar18)) {
              lVar14 = 0;
              do {
                worker->ycells[lVar14] = (PCell_conflict)0x0;
                lVar14 = lVar14 + 1;
              } while (lVar18 != lVar14);
            }
            unaff_EBP = iVar16;
            if (iVar13 == 7) {
LAB_00122043:
              lVar14 = *local_2e0;
              lVar18 = local_2e0[1];
              if ((ulong)(lVar18 - lVar14) < 2) {
                iVar13 = 1;
                unaff_EBP = -6;
              }
              else {
                if ((long)worker->band_size <= lVar14 - lVar18) {
                  worker->band_shoot = worker->band_shoot + 1;
                }
                lVar10 = (lVar18 - lVar14 >> 1) + lVar14;
                local_2e0[2] = lVar14;
                local_2e0[3] = lVar10;
                *local_2e0 = lVar10;
                local_2e0[1] = lVar18;
                local_2e0 = local_2e0 + 2;
                iVar13 = 0;
              }
            }
            else if (iVar13 == 0) {
              worker->num_cells = 0;
              worker->invalid = 1;
              worker->min_ey = *local_2e0;
              worker->max_ey = local_2e0[1];
              worker->count_ey = local_2e0[1] - *local_2e0;
              iVar9 = gray_convert_glyph_inner(worker);
              if (iVar9 == -4) goto LAB_00122043;
              iVar13 = 1;
              unaff_EBP = 1;
              if (iVar9 == 0) {
                if ((worker->num_cells != 0) && (0 < worker->ycount)) {
                  lVar14 = 0;
                  do {
                    pTVar20 = worker->ycells[lVar14];
                    if (pTVar20 == (PCell_conflict)0x0) {
                      lVar18 = 0;
                      x = 0;
                    }
                    else {
                      x = 0;
                      lVar18 = 0;
                      do {
                        if ((lVar18 != 0) && (x < pTVar20->x)) {
                          gray_hline(worker,x,lVar14,lVar18 << 9,pTVar20->x - (int)x);
                        }
                        lVar18 = lVar18 + pTVar20->cover;
                        lVar10 = lVar18 * 0x200 - pTVar20->area;
                        if ((lVar10 != 0) && (-1 < (long)pTVar20->x)) {
                          gray_hline(worker,(long)pTVar20->x,lVar14,lVar10,1);
                        }
                        x = (long)pTVar20->x + 1;
                        pTVar20 = pTVar20->next;
                      } while (pTVar20 != (PCell)0x0);
                    }
                    if ((lVar18 != 0) && (x < worker->count_ex)) {
                      gray_hline(worker,x,lVar14,lVar18 << 9,(int)worker->count_ex - (int)x);
                    }
                    lVar14 = lVar14 + 1;
                  } while (lVar14 < worker->ycount);
                }
                local_2e0 = local_2e0 + -2;
                iVar13 = 5;
                unaff_EBP = iVar16;
              }
            }
            if ((iVar13 != 5) && (iVar13 != 0)) {
              return unaff_EBP;
            }
            iVar16 = unaff_EBP;
          } while (&local_2b8 <= local_2e0);
          local_2d4 = local_2d4 + 1;
          local_2c8 = local_2d0;
        } while (local_2d4 < local_2d8);
      }
      if (worker->render_span != (PVG_FT_SpanFunc)0x0) {
        uVar1 = worker->skip_spans;
        if ((int)uVar1 < worker->num_gray_spans) {
          uVar15 = 0;
          if (0 < (int)uVar1) {
            uVar15 = (ulong)uVar1;
          }
          (*worker->render_span)
                    (worker->num_gray_spans - (int)uVar15,worker->gray_spans + uVar15,
                     worker->render_span_data);
        }
      }
      worker->skip_spans = worker->skip_spans - worker->num_gray_spans;
      if (worker->band_shoot < 9) {
        return 0;
      }
      if (worker->band_size < 0x11) {
        return 0;
      }
      worker->band_size = (uint)worker->band_size >> 1;
      return 0;
    }
  }
  return -1;
}

Assistant:

static int
  gray_raster_render( RAS_ARG_ void* buffer, long buffer_size,
                      const PVG_FT_Raster_Params*  params )
  {
    const PVG_FT_Outline*  outline    = (const PVG_FT_Outline*)params->source;
    if ( outline == NULL )
      return ErrRaster_Invalid_Outline;

    /* return immediately if the outline is empty */
    if ( outline->n_points == 0 || outline->n_contours <= 0 )
      return 0;

    if ( !outline->contours || !outline->points )
      return ErrRaster_Invalid_Outline;

    if ( outline->n_points !=
           outline->contours[outline->n_contours - 1] + 1 )
      return ErrRaster_Invalid_Outline;

    /* this version does not support monochrome rendering */
    if ( !( params->flags & PVG_FT_RASTER_FLAG_AA ) )
      return ErrRaster_Invalid_Mode;

    if ( !( params->flags & PVG_FT_RASTER_FLAG_DIRECT ) )
      return ErrRaster_Invalid_Mode;

    /* compute clipping box */
    if ( params->flags & PVG_FT_RASTER_FLAG_CLIP )
    {
      ras.clip_box = params->clip_box;
    }
    else
    {
      ras.clip_box.xMin = -(1 << 23);
      ras.clip_box.yMin = -(1 << 23);
      ras.clip_box.xMax =  (1 << 23) - 1;
      ras.clip_box.yMax =  (1 << 23) - 1;
    }

    gray_init_cells( RAS_VAR_ buffer, buffer_size );

    ras.outline   = *outline;
    ras.num_cells = 0;
    ras.invalid   = 1;
    ras.band_size = (int)(buffer_size / (long)(sizeof(TCell) * 8));

    ras.render_span      = (PVG_FT_Raster_Span_Func)params->gray_spans;
    ras.render_span_data = params->user;

    return gray_convert_glyph( RAS_VAR );
  }